

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigTempor.c
# Opt level: O2

Aig_Man_t *
Saig_ManTempor(Aig_Man_t *pAig,int nFrames,int TimeOut,int nConfLimit,int fUseBmc,int fUseTransSigs,
              int fVerbose,int fVeryVerbose)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  int iLast;
  Vec_Int_t *pVVar4;
  char *pcVar5;
  int i;
  uint i_00;
  Vec_Int_t *vTransSigs;
  int nFramesFinished;
  int local_3c;
  int local_38;
  int local_34;
  
  vTransSigs = (Vec_Int_t *)0x0;
  nFramesFinished = -1;
  if (nFrames < 0) {
    __assert_fail("nFrames >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigTempor.c"
                  ,0xc0,"Aig_Man_t *Saig_ManTempor(Aig_Man_t *, int, int, int, int, int, int, int)")
    ;
  }
  local_34 = TimeOut;
  if (nFrames == 0) {
    pAVar3 = pAig;
    local_38 = nConfLimit;
    nFrames = Saig_ManPhasePrefixLength(pAig,fVerbose,fVeryVerbose,&vTransSigs);
    iVar1 = (int)pAVar3;
    if (nFrames == 1) {
      Vec_IntFreeP(&vTransSigs);
      pcVar5 = "The leading sequence has length 1. Temporal decomposition is not performed.";
LAB_0059f000:
      puts(pcVar5);
      return (Aig_Man_t *)0x0;
    }
    if (nFrames == 0) {
      Vec_IntFreeP(&vTransSigs);
      pcVar5 = "The leading sequence has length 0. Temporal decomposition is not performed.";
      goto LAB_0059f000;
    }
    if (fUseTransSigs != 0) {
      uVar2 = 0xffffffff;
      local_3c = fUseTransSigs;
      for (i_00 = 0; (int)i_00 < vTransSigs->nSize; i_00 = i_00 + 1) {
        iVar1 = Vec_IntEntry(vTransSigs,i_00);
        if (iVar1 != 0) {
          uVar2 = i_00;
        }
      }
      pVVar4 = vTransSigs;
      if ((int)uVar2 < nFrames && 0 < (int)uVar2) {
        Abc_Print((int)vTransSigs,"Reducing frame count from %d to %d to fit the last transient.\n",
                  (ulong)(uint)nFrames,(ulong)uVar2);
        nFrames = uVar2;
      }
      iVar1 = (int)pVVar4;
      fUseTransSigs = local_3c;
    }
    Abc_Print(iVar1,"Using computed frame number (%d).\n",(ulong)(uint)nFrames);
    nConfLimit = local_38;
  }
  else {
    Abc_Print((int)pAig,"Using user-given frame number (%d).\n",nFrames);
  }
  uVar2 = nFrames;
  if (fUseBmc != 0) {
    iVar1 = Saig_BmcPerform(pAig,0,nFrames,2000,local_34,nConfLimit,0,fVerbose,0,&nFramesFinished,0,
                            0);
    if (iVar1 == 0) {
      Vec_IntFreeP(&vTransSigs);
      pcVar5 = "A cex found in the first %d frames.\n";
LAB_0059f06c:
      printf(pcVar5,(ulong)(uint)nFrames);
      return (Aig_Man_t *)0x0;
    }
    if (nFramesFinished + 1 < nFrames) {
      uVar2 = Vec_IntLastNonZeroBeforeLimit(vTransSigs,nFramesFinished);
      if (fUseTransSigs == 0 || (int)uVar2 < 1) {
        Vec_IntFreeP(&vTransSigs);
        pcVar5 = "BMC for %d frames could not be completed. A cex may exist!\n";
        goto LAB_0059f06c;
      }
      if (nFramesFinished <= (int)uVar2) {
        __assert_fail("iLastBefore < nFramesFinished",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigTempor.c"
                      ,0xf2,
                      "Aig_Man_t *Saig_ManTempor(Aig_Man_t *, int, int, int, int, int, int, int)");
      }
      printf("BMC succeeded to frame %d. Adjusting frame count to be (%d) based on the last transient signal.\n"
             ,(ulong)(uint)nFramesFinished,(ulong)uVar2);
    }
  }
  Vec_IntFreeP(&vTransSigs);
  pAVar3 = Saig_ManTemporDecompose(pAig,uVar2);
  return pAVar3;
}

Assistant:

Aig_Man_t * Saig_ManTempor( Aig_Man_t * pAig, int nFrames, int TimeOut, int nConfLimit, int fUseBmc, int fUseTransSigs, int fVerbose, int fVeryVerbose )
{ 
    extern int Saig_ManPhasePrefixLength( Aig_Man_t * p, int fVerbose, int fVeryVerbose, Vec_Int_t ** pvTrans );

    Vec_Int_t * vTransSigs = NULL;
    int RetValue, nFramesFinished = -1;
    assert( nFrames >= 0 ); 
    if ( nFrames == 0 )
    {
        nFrames = Saig_ManPhasePrefixLength( pAig, fVerbose, fVeryVerbose, &vTransSigs );
        if ( nFrames == 0 )
        {
            Vec_IntFreeP( &vTransSigs );
            printf( "The leading sequence has length 0. Temporal decomposition is not performed.\n" );
            return NULL;
        }
        if ( nFrames == 1 )
        {
            Vec_IntFreeP( &vTransSigs );
            printf( "The leading sequence has length 1. Temporal decomposition is not performed.\n" );
            return NULL;
        }
        if ( fUseTransSigs )
        {
            int Entry, i, iLast = -1;
            Vec_IntForEachEntry( vTransSigs, Entry, i )
                iLast = Entry ? i :iLast;
            if ( iLast > 0 && iLast < nFrames )
            {
                Abc_Print( 1, "Reducing frame count from %d to %d to fit the last transient.\n", nFrames, iLast );
                nFrames = iLast;
            }
        }
        Abc_Print( 1, "Using computed frame number (%d).\n", nFrames );
    }
    else
        Abc_Print( 1, "Using user-given frame number (%d).\n", nFrames );
    // run BMC2
    if ( fUseBmc )
    {
        RetValue = Saig_BmcPerform( pAig, 0, nFrames, 2000, TimeOut, nConfLimit, 0, fVerbose, 0, &nFramesFinished, 0, 0 );
        if ( RetValue == 0 )
        {
            Vec_IntFreeP( &vTransSigs );
            printf( "A cex found in the first %d frames.\n", nFrames );
            return NULL;
        }
        if ( nFramesFinished + 1 < nFrames )
        {
            int iLastBefore = Vec_IntLastNonZeroBeforeLimit( vTransSigs, nFramesFinished );
            if ( iLastBefore < 1 || !fUseTransSigs )
            {
                Vec_IntFreeP( &vTransSigs );
                printf( "BMC for %d frames could not be completed. A cex may exist!\n", nFrames );
                return NULL;
            }
            assert( iLastBefore < nFramesFinished );
            printf( "BMC succeeded to frame %d. Adjusting frame count to be (%d) based on the last transient signal.\n", nFramesFinished, iLastBefore );
            nFrames = iLastBefore;
        }
    }
    Vec_IntFreeP( &vTransSigs );
    return Saig_ManTemporDecompose( pAig, nFrames );
}